

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeDeviceReleaseExternalSemaphoreExt(ze_external_semaphore_ext_handle_t hSemaphore)

{
  ulong uVar1;
  _func__ze_result_t__ze_external_semaphore_ext_handle_t_ptr *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_device_release_external_semaphore_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var7;
  long lVar8;
  _ze_external_semaphore_ext_handle_t *in_RDI;
  size_t i;
  ulong uVar9;
  ze_device_release_external_semaphore_ext_params_t tracerParams;
  APITracerCallbackDataImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_external_semaphore_ext_handle_t local_c8;
  _ze_device_release_external_semaphore_ext_params_t local_c0;
  APITracerCallbackDataImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_b8;
  value_type local_80;
  value_type local_70;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_60;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_48;
  
  if (DAT_001892d8 == (_func__ze_result_t__ze_external_semaphore_ext_handle_t_ptr *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_001892d8)(in_RDI);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    local_b8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.apiOrdinal =
         (_func_void__ze_device_release_external_semaphore_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    local_b8.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.phSemaphore = &local_c8;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_device_release_external_semaphore_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = local_b8.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        local_70.current_api_callback =
             *(_func_void__ze_device_release_external_semaphore_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0xb50) + lVar8);
        p_Var7 = *(_func_void__ze_device_release_external_semaphore_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x4f8) + lVar8);
        local_70.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&local_b8.prologCallbacks,&local_70);
        local_80.pUserData = *(void **)(puVar6[1] + lVar8);
        local_80.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&local_b8.epilogCallbacks,&local_80);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_001892d8;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_48,&local_b8.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_60,&local_b8.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_external_semaphore_ext_handle_t*),_ze_device_release_external_semaphore_ext_params_t*,void(*)(_ze_device_release_external_semaphore_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_release_external_semaphore_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_release_external_semaphore_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_release_external_semaphore_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_release_external_semaphore_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_external_semaphore_ext_handle_t*&>
                      (zeApiPtr,&local_c0,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_48,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_60,&local_c8);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_60);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_48);
    APITracerCallbackDataImp<void_(*)(_ze_device_release_external_semaphore_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&local_b8);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceReleaseExternalSemaphoreExt(
        ze_external_semaphore_ext_handle_t hSemaphore   ///< [in] The handle of the external semaphore.
        )
    {
        auto pfnReleaseExternalSemaphoreExt = context.zeDdiTable.Device.pfnReleaseExternalSemaphoreExt;

        if( nullptr == pfnReleaseExternalSemaphoreExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Device.pfnReleaseExternalSemaphoreExt, hSemaphore);

        // capture parameters
        ze_device_release_external_semaphore_ext_params_t tracerParams = {
            &hSemaphore
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnDeviceReleaseExternalSemaphoreExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnDeviceReleaseExternalSemaphoreExtCb_t, Device, pfnReleaseExternalSemaphoreExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Device.pfnReleaseExternalSemaphoreExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phSemaphore);
    }